

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_diamond_box.cxx
# Opt level: O2

void fl_diamond_up_box(int x,int y,int w,int h,Fl_Color bgcolor)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uchar *puVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  
  uVar8 = w & 0xfffffffe;
  uVar9 = h & 0xfffffffe;
  uVar2 = (w >> 1) + x;
  uVar10 = (h >> 1) + y;
  Fl::set_box_color(bgcolor);
  uVar1 = x + 3;
  uVar6 = (uVar8 + x) - 3;
  uVar5 = (y + uVar9) - 3;
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x17])
            (fl_graphics_driver,(ulong)uVar1,(ulong)uVar10,(ulong)uVar2,(ulong)(y + 3U),(ulong)uVar6
             ,uVar10,uVar2,uVar5);
  puVar4 = fl_gray_ramp();
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
            (fl_graphics_driver,(ulong)puVar4[0x57]);
  uVar3 = (uVar8 - 1) + x;
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xd])
            (fl_graphics_driver,(ulong)(x + 1U),(ulong)uVar10,(ulong)uVar2,(ulong)(y + 1),
             (ulong)uVar3,uVar10);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
            (fl_graphics_driver,(ulong)puVar4[0x55]);
  uVar7 = (uVar8 + x) - 2;
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xd])
            (fl_graphics_driver,(ulong)(x + 2U),(ulong)uVar10,(ulong)uVar2,(ulong)(y + 2),
             (ulong)uVar7,uVar10);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
            (fl_graphics_driver,(ulong)puVar4[0x53]);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xd])
            (fl_graphics_driver,(ulong)uVar1,(ulong)uVar10,(ulong)uVar2,(ulong)(y + 3U),(ulong)uVar6
             ,uVar10);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
            (fl_graphics_driver,(ulong)puVar4[0x50]);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xd])
            (fl_graphics_driver,(ulong)uVar1,(ulong)uVar10,(ulong)uVar2,(ulong)uVar5,(ulong)uVar6,
             uVar10);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
            (fl_graphics_driver,(ulong)puVar4[0x4e]);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xd])
            (fl_graphics_driver,(ulong)(x + 2U),(ulong)uVar10,(ulong)uVar2,(ulong)((uVar9 + y) - 2),
             (ulong)uVar7,uVar10);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
            (fl_graphics_driver,(ulong)puVar4[0x48]);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xd])
            (fl_graphics_driver,(ulong)(x + 1U),(ulong)uVar10,(ulong)uVar2,(ulong)((uVar9 + y) - 1),
             (ulong)uVar3,uVar10);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
            (fl_graphics_driver,(ulong)puVar4[0x41]);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x15])
            (fl_graphics_driver,(ulong)(uint)x,(ulong)uVar10,(ulong)uVar2,y,(ulong)(uVar8 + x),
             uVar10,uVar2,uVar9 + y);
  return;
}

Assistant:

static void fl_diamond_up_box(int x,int y,int w,int h,Fl_Color bgcolor) {
  w &= -2;
  h &= -2;
  int x1 = x+w/2;
  int y1 = y+h/2;
  Fl::set_box_color(bgcolor);
  fl_polygon(x+3, y1, x1,y+3, x+w-3,y1, x1,y+h-3);
  const uchar *g = fl_gray_ramp();
  fl_color(g[(int)'W']); fl_line(x+1, y1, x1, y+1, x+w-1, y1);
  fl_color(g[(int)'U']); fl_line(x+2, y1, x1, y+2, x+w-2, y1);
  fl_color(g[(int)'S']); fl_line(x+3, y1, x1, y+3, x+w-3, y1);
  fl_color(g[(int)'P']); fl_line(x+3, y1, x1, y+h-3, x+w-3, y1);
  fl_color(g[(int)'N']); fl_line(x+2, y1, x1, y+h-2, x+w-2, y1);
  fl_color(g[(int)'H']); fl_line(x+1, y1, x1, y+h-1, x+w-1, y1);
  fl_color(g[(int)'A']); fl_loop(x, y1, x1, y, x+w, y1, x1, y+h);
}